

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O3

void __thiscall
CDirectiveConditional::CDirectiveConditional
          (CDirectiveConditional *this,ConditionType type,Identifier *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Label *__tmp;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *args;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveConditional_001c9b78;
  (this->expression).expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->expression).expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->expression).constExpression = true;
  (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->type = type;
  this->previousResult = false;
  (this->ifBlock)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  (this->elseBlock)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  SymbolTable::getLabel
            ((SymbolTable *)&local_38,(Identifier *)&Global.symbolTable,(int)name,
             Global.FileInfo.FileNum);
  args = p_Stack_30;
  peVar1 = local_38;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  this_00 = (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = args;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
    peVar1 = (this->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (peVar1 == (element_type *)0x0) {
    Logger::printError<Identifier>((Logger *)0x1,0x1871cd,(char *)name,(Identifier *)args);
  }
  return;
}

Assistant:

CDirectiveConditional::CDirectiveConditional(ConditionType type, const Identifier& name)
	: CDirectiveConditional(type)
{
	label = Global.symbolTable.getLabel(name,Global.FileInfo.FileNum,Global.Section);
	if (label == nullptr)
		Logger::printError(Logger::Error, "Invalid label name \"%s\"",name);
}